

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O2

void __thiscall
vkt::BindingModel::anon_unknown_1::SingleCmdRenderInstance::renderToTarget
          (SingleCmdRenderInstance *this)

{
  byte bVar1;
  DeviceInterface *pDVar2;
  VkDevice device;
  BinaryCollection *programCollection;
  uint uVar3;
  int iVar4;
  VkResult VVar5;
  undefined4 extraout_var;
  VkPhysicalDeviceFeatures *deviceFeatures;
  VkSampleMask sampleMask;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_488;
  RenderInstanceShaders shaderStages;
  VkCommandBufferBeginInfo passCmdBufBeginInfo;
  undefined4 local_388 [2];
  undefined8 local_380;
  deUint64 local_378;
  deUint64 local_370;
  undefined8 local_368;
  undefined8 local_360;
  undefined4 local_358;
  undefined8 *local_350;
  VkPipelineRasterizationStateCreateInfo rsState;
  undefined1 local_308 [16];
  VkDevice local_2f8;
  VkCommandPool VStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  VkCommandBufferBeginInfo mainCmdBufBeginInfo;
  undefined1 local_278 [24];
  VkCommandPool VStack_260;
  VkPipelineVertexInputStateCreateInfo *local_258;
  VkPipelineInputAssemblyStateCreateInfo *local_250;
  VkPipelineTessellationStateCreateInfo *local_248;
  VkPipelineViewportStateCreateInfo *local_240;
  VkPipelineRasterizationStateCreateInfo *local_238;
  VkPipelineMultisampleStateCreateInfo *local_230;
  VkPipelineDepthStencilStateCreateInfo *local_228;
  VkPipelineColorBlendStateCreateInfo *local_220;
  VkPipelineDynamicStateCreateInfo *local_218;
  VkPipelineLayout local_210;
  VkRenderPass local_208;
  deUint32 local_200;
  VkPipeline local_1f8;
  deInt32 local_1f0;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_1e8;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  VkRect2D renderArea;
  VkPipelineTessellationStateCreateInfo tessState;
  VkViewport local_190;
  VkPipelineColorBlendAttachmentState cbAttachment;
  VkPipelineInputAssemblyStateCreateInfo iaState;
  VkPipelineVertexInputStateCreateInfo vertexInputState;
  VkPipelineMultisampleStateCreateInfo msState;
  VkPipelineViewportStateCreateInfo vpState;
  VkCommandBufferInheritanceInfo passCmdBufInheritInfo;
  VkPipelineColorBlendStateCreateInfo local_68;
  
  mainCmdBufBeginInfo.flags = 1;
  mainCmdBufBeginInfo._20_4_ = 0;
  mainCmdBufBeginInfo.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)0x0;
  passCmdBufBeginInfo.pInheritanceInfo = &passCmdBufInheritInfo;
  passCmdBufInheritInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_INHERITANCE_INFO;
  passCmdBufInheritInfo.pNext = (void *)0x0;
  mainCmdBufBeginInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
  mainCmdBufBeginInfo._4_4_ = 0;
  mainCmdBufBeginInfo.pNext = (void *)0x0;
  local_378 = (this->super_SingleTargetRenderInstance).m_renderPass.
              super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  passCmdBufInheritInfo.subpass = 0;
  local_370 = (this->super_SingleTargetRenderInstance).m_framebuffer.
              super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal;
  passCmdBufInheritInfo.occlusionQueryEnable = 0;
  passCmdBufInheritInfo.queryFlags = 0;
  passCmdBufInheritInfo.pipelineStatistics = 0;
  passCmdBufBeginInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
  passCmdBufBeginInfo.pNext = (void *)0x0;
  passCmdBufBeginInfo.flags = 3;
  local_388[0] = 0x2b;
  local_380 = 0;
  local_368 = 0;
  local_350 = &local_1c8;
  local_1c8 = 0;
  uStack_1c0 = 0;
  local_360 = *(undefined8 *)(this->super_SingleTargetRenderInstance).m_targetSize.m_data;
  local_358 = 1;
  passCmdBufInheritInfo.renderPass.m_internal = local_378;
  passCmdBufInheritInfo.framebuffer.m_internal = local_370;
  iVar4 = (*(this->super_SingleTargetRenderInstance).super_TestInstance._vptr_TestInstance[6])();
  pDVar2 = (this->super_SingleTargetRenderInstance).m_vki;
  device = (this->super_SingleTargetRenderInstance).m_device;
  deviceFeatures =
       Context::getDeviceFeatures
                 ((this->super_SingleTargetRenderInstance).super_TestInstance.m_context);
  programCollection =
       ((this->super_SingleTargetRenderInstance).super_TestInstance.m_context)->m_progCollection;
  memset(&shaderStages,0,0xb8);
  RenderInstanceShaders::addStage
            (&shaderStages,pDVar2,device,deviceFeatures,programCollection,"vertex",
             VK_SHADER_STAGE_VERTEX_BIT,&shaderStages.m_vertexShaderModule);
  RenderInstanceShaders::addStage
            (&shaderStages,pDVar2,device,deviceFeatures,programCollection,"tess_ctrl",
             VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,&shaderStages.m_tessCtrlShaderModule);
  RenderInstanceShaders::addStage
            (&shaderStages,pDVar2,device,deviceFeatures,programCollection,"tess_eval",
             VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,&shaderStages.m_tessEvalShaderModule);
  RenderInstanceShaders::addStage
            (&shaderStages,pDVar2,device,deviceFeatures,programCollection,"geometry",
             VK_SHADER_STAGE_GEOMETRY_BIT,&shaderStages.m_geometryShaderModule);
  RenderInstanceShaders::addStage
            (&shaderStages,pDVar2,device,deviceFeatures,programCollection,"fragment",
             VK_SHADER_STAGE_FRAGMENT_BIT,&shaderStages.m_fragmentShaderModule);
  uVar3 = 3;
  if (shaderStages.m_tessEvalShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
      object.m_internal != 0 ||
      shaderStages.m_tessCtrlShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
      object.m_internal != 0) {
    uVar3 = 10;
  }
  local_258 = &vertexInputState;
  vertexInputState.pNext = (void *)0x0;
  vertexInputState.vertexAttributeDescriptionCount = 0;
  vertexInputState._36_4_ = 0;
  vertexInputState.pVertexAttributeDescriptions = (VkVertexInputAttributeDescription *)0x0;
  vertexInputState.flags = 0;
  vertexInputState.vertexBindingDescriptionCount = 0;
  vertexInputState.pVertexBindingDescriptions = (VkVertexInputBindingDescription *)0x0;
  vertexInputState.sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
  vertexInputState._4_4_ = 0;
  local_250 = &iaState;
  iaState.pNext = (void *)0x0;
  iaState.primitiveRestartEnable = 0;
  iaState._28_4_ = 0;
  iaState.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO;
  iaState._4_4_ = 0;
  iaState._16_8_ = (ulong)uVar3 << 0x20;
  tessState.flags = 0;
  tessState.patchControlPoints = 3;
  tessState.sType = VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_STATE_CREATE_INFO;
  tessState._4_4_ = 0;
  tessState.pNext = (void *)0x0;
  local_248 = &tessState;
  if (shaderStages.m_tessEvalShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
      object.m_internal == 0 &&
      shaderStages.m_tessCtrlShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
      object.m_internal == 0) {
    local_248 = (VkPipelineTessellationStateCreateInfo *)0x0;
  }
  vpState.pViewports = &local_190;
  local_190.x = 0.0;
  local_190.y = 0.0;
  renderArea.extent.width = (this->super_SingleTargetRenderInstance).m_targetSize.m_data[0];
  local_190.width = (float)renderArea.extent.width;
  renderArea.extent.height = (this->super_SingleTargetRenderInstance).m_targetSize.m_data[1];
  local_190.height = (float)renderArea.extent.height;
  vpState.pScissors = &renderArea;
  renderArea.offset.x = 0;
  renderArea.offset.y = 0;
  local_190.minDepth = 0.0;
  local_190.maxDepth = 1.0;
  local_240 = &vpState;
  vpState.sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  vpState.pNext = (void *)0x0;
  vpState.flags = 0;
  vpState.viewportCount = 1;
  sampleMask = 1;
  local_238 = &rsState;
  rsState.pNext = (void *)0x0;
  rsState.rasterizerDiscardEnable = 0;
  rsState.polygonMode = VK_POLYGON_MODE_FILL;
  rsState.depthBiasClamp = 0.0;
  rsState.depthBiasSlopeFactor = 0.0;
  rsState.cullMode = 0;
  rsState.frontFace = VK_FRONT_FACE_COUNTER_CLOCKWISE;
  rsState.depthBiasEnable = 0;
  rsState.depthBiasConstantFactor = 0.0;
  rsState.sType = VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO;
  rsState._4_4_ = 0;
  msState.pSampleMask = &sampleMask;
  local_230 = &msState;
  msState.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
  msState.flags = 0;
  msState.rasterizationSamples = VK_SAMPLE_COUNT_1_BIT;
  msState.sampleShadingEnable = 0;
  msState.minSampleShading = 0.0;
  msState.pNext = (void *)0x0;
  rsState.flags = 0;
  rsState.depthClampEnable = 1;
  msState.alphaToCoverageEnable = 0;
  msState.alphaToOneEnable = 0;
  rsState.lineWidth = 1.0;
  rsState._60_4_ = 0;
  local_228 = (VkPipelineDepthStencilStateCreateInfo *)local_308;
  local_308._8_8_ = (DeviceInterface *)0x0;
  local_2f8 = (VkDevice)0x0;
  uStack_2d0 = 0;
  uStack_2b0 = 0;
  local_2c8 = 0;
  uStack_2c0 = 0;
  local_2e8 = 0;
  uStack_2e0 = 0;
  local_308._0_8_ = (VkCommandBuffer_s *)0x19;
  VStack_2f0.m_internal = 0x700000000;
  local_2d8 = 0x700000000;
  local_2b8 = 7;
  local_2a8 = 0x3f800000bf800000;
  local_68.pAttachments = &cbAttachment;
  cbAttachment.srcAlphaBlendFactor = VK_BLEND_FACTOR_ZERO;
  cbAttachment.dstAlphaBlendFactor = VK_BLEND_FACTOR_ZERO;
  cbAttachment.alphaBlendOp = VK_BLEND_OP_ADD;
  cbAttachment.colorWriteMask = 0xf;
  cbAttachment.blendEnable = 0;
  cbAttachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
  cbAttachment.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
  cbAttachment.colorBlendOp = VK_BLEND_OP_ADD;
  local_220 = &local_68;
  local_68.sType = VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO;
  local_68.pNext = (void *)0x0;
  local_68.flags = 0;
  local_68.logicOpEnable = 0;
  local_68.logicOp = VK_LOGIC_OP_CLEAR;
  local_68.attachmentCount = 1;
  local_68.blendConstants[0] = 0.0;
  local_68.blendConstants[1] = 0.0;
  local_68.blendConstants[2] = 0.0;
  local_68.blendConstants[3] = 0.0;
  local_278._0_4_ = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
  local_278._8_8_ = (DeviceInterface *)0x0;
  local_278._16_8_ =
       ((long)shaderStages.m_stageInfos.
              super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish -
       (long)shaderStages.m_stageInfos.
             super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
             ._M_impl.super__Vector_impl_data._M_start) / 0x30 << 0x20;
  VStack_260.m_internal =
       (deUint64)
       shaderStages.m_stageInfos.
       super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_218 = (VkPipelineDynamicStateCreateInfo *)0x0;
  local_208.m_internal =
       (this->super_SingleTargetRenderInstance).m_renderPass.
       super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  local_200 = 0;
  local_1f8.m_internal = 0;
  local_1f0 = 0;
  local_210.m_internal = CONCAT44(extraout_var,iVar4);
  vpState.scissorCount = sampleMask;
  ::vk::createGraphicsPipeline
            ((Move<vk::Handle<(vk::HandleType)18>_> *)&local_1e8,
             (this->super_SingleTargetRenderInstance).m_vki,
             (this->super_SingleTargetRenderInstance).m_device,(VkPipelineCache)0x0,
             (VkGraphicsPipelineCreateInfo *)local_278,(VkAllocationCallbacks *)0x0);
  RenderInstanceShaders::~RenderInstanceShaders(&shaderStages);
  local_488.m_data.object.m_internal = local_1e8.m_data.object.m_internal;
  local_488.m_data.deleter.m_deviceIface = local_1e8.m_data.deleter.m_deviceIface;
  local_488.m_data.deleter.m_device = local_1e8.m_data.deleter.m_device;
  local_488.m_data.deleter.m_allocator = local_1e8.m_data.deleter.m_allocator;
  local_1e8.m_data.object.m_internal = 0;
  local_1e8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_1e8.m_data.deleter.m_device = (VkDevice)0x0;
  local_1e8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_1e8);
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&shaderStages,
             (this->super_SingleTargetRenderInstance).m_vki,
             (this->super_SingleTargetRenderInstance).m_device,
             (VkCommandPool)
             (this->super_SingleTargetRenderInstance).m_cmdPool.
             super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_278._16_8_ =
       shaderStages.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
       deleter.m_device;
  VStack_260.m_internal =
       (deUint64)
       shaderStages.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
       deleter.m_allocator;
  local_278._0_8_ =
       shaderStages.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
       object.m_internal;
  local_278._8_8_ =
       shaderStages.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
       deleter.m_deviceIface;
  shaderStages.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal = 0;
  shaderStages.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  shaderStages.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_device = (VkDevice)0x0;
  shaderStages.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&shaderStages);
  if ((this->super_SingleTargetRenderInstance).field_0xf9 == '\x01') {
    shaderStages.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
    m_device = (VkDevice)0x0;
    shaderStages.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)0x0;
    shaderStages.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
    m_internal = 0;
    shaderStages.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)0x0;
  }
  else {
    ::vk::allocateCommandBuffer
              ((Move<vk::VkCommandBuffer_s_*> *)&shaderStages,
               (this->super_SingleTargetRenderInstance).m_vki,
               (this->super_SingleTargetRenderInstance).m_device,
               (VkCommandPool)
               (this->super_SingleTargetRenderInstance).m_cmdPool.
               super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal,
               VK_COMMAND_BUFFER_LEVEL_SECONDARY);
  }
  local_2f8 = shaderStages.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.
              m_data.deleter.m_device;
  VStack_2f0.m_internal =
       (deUint64)
       shaderStages.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
       deleter.m_allocator;
  local_308._0_8_ =
       shaderStages.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
       object.m_internal;
  local_308._8_8_ =
       shaderStages.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
       deleter.m_deviceIface;
  shaderStages.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal = 0;
  shaderStages.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  shaderStages.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_device = (VkDevice)0x0;
  shaderStages.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&shaderStages);
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&shaderStages,
                    (this->super_SingleTargetRenderInstance).m_vki,
                    (this->super_SingleTargetRenderInstance).m_device,0,(VkAllocationCallbacks *)0x0
                   );
  rsState._16_8_ =
       shaderStages.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
       deleter.m_device;
  rsState._24_8_ =
       shaderStages.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
       deleter.m_allocator;
  rsState._0_8_ =
       shaderStages.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
       object.m_internal;
  rsState.pNext =
       shaderStages.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
       deleter.m_deviceIface;
  shaderStages.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal = 0;
  shaderStages.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  shaderStages.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_device = (VkDevice)0x0;
  shaderStages.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)6>_> *)&shaderStages);
  bVar1 = (this->super_SingleTargetRenderInstance).field_0xf9;
  pDVar2 = (this->super_SingleTargetRenderInstance).m_vki;
  VVar5 = (*pDVar2->_vptr_DeviceInterface[0x49])(pDVar2,local_278._0_8_,&mainCmdBufBeginInfo);
  ::vk::checkResult(VVar5,"m_vki.beginCommandBuffer(*mainCmd, &mainCmdBufBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/binding_model/vktBindingShaderAccessTests.cpp"
                    ,0x4a4);
  pDVar2 = (this->super_SingleTargetRenderInstance).m_vki;
  (*pDVar2->_vptr_DeviceInterface[0x74])(pDVar2,local_278._0_8_,local_388,(ulong)(bVar1 ^ 1));
  pDVar2 = (this->super_SingleTargetRenderInstance).m_vki;
  if ((this->super_SingleTargetRenderInstance).field_0xf9 == '\x01') {
    (*pDVar2->_vptr_DeviceInterface[0x4c])
              (pDVar2,local_278._0_8_,0,local_488.m_data.object.m_internal);
    (*(this->super_SingleTargetRenderInstance).super_TestInstance._vptr_TestInstance[7])
              (this,local_278._0_8_);
  }
  else {
    VVar5 = (*pDVar2->_vptr_DeviceInterface[0x49])(pDVar2,local_308._0_8_,&passCmdBufBeginInfo);
    ::vk::checkResult(VVar5,"m_vki.beginCommandBuffer(*passCmd, &passCmdBufBeginInfo)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/binding_model/vktBindingShaderAccessTests.cpp"
                      ,0x4ae);
    pDVar2 = (this->super_SingleTargetRenderInstance).m_vki;
    (*pDVar2->_vptr_DeviceInterface[0x4c])
              (pDVar2,local_308._0_8_,0,local_488.m_data.object.m_internal);
    (*(this->super_SingleTargetRenderInstance).super_TestInstance._vptr_TestInstance[7])
              (this,local_308._0_8_);
    pDVar2 = (this->super_SingleTargetRenderInstance).m_vki;
    VVar5 = (*pDVar2->_vptr_DeviceInterface[0x4a])(pDVar2,local_308._0_8_);
    ::vk::checkResult(VVar5,"m_vki.endCommandBuffer(*passCmd)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/binding_model/vktBindingShaderAccessTests.cpp"
                      ,0x4b1);
    pDVar2 = (this->super_SingleTargetRenderInstance).m_vki;
    (*pDVar2->_vptr_DeviceInterface[0x77])(pDVar2,local_278._0_8_,1,local_308);
  }
  pDVar2 = (this->super_SingleTargetRenderInstance).m_vki;
  (*pDVar2->_vptr_DeviceInterface[0x76])(pDVar2,local_278._0_8_);
  pDVar2 = (this->super_SingleTargetRenderInstance).m_vki;
  VVar5 = (*pDVar2->_vptr_DeviceInterface[0x4a])(pDVar2,local_278._0_8_);
  ::vk::checkResult(VVar5,"m_vki.endCommandBuffer(*mainCmd)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/binding_model/vktBindingShaderAccessTests.cpp"
                    ,0x4b7);
  shaderStages.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  shaderStages.m_tessCtrlShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal = 0;
  shaderStages.m_tessCtrlShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)0x0;
  shaderStages.m_tessEvalShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal = 0;
  shaderStages.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_device = (VkDevice)0x0;
  shaderStages.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)0x0;
  shaderStages.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal = 4;
  shaderStages.m_tessCtrlShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x1;
  pDVar2 = (this->super_SingleTargetRenderInstance).m_vki;
  shaderStages.m_tessCtrlShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_device = (VkDevice)local_278;
  VVar5 = (*pDVar2->_vptr_DeviceInterface[2])
                    (pDVar2,(this->super_SingleTargetRenderInstance).m_queue,1,&shaderStages,
                     rsState._0_8_);
  ::vk::checkResult(VVar5,"m_vki.queueSubmit(m_queue, 1, &submitInfo, *fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/binding_model/vktBindingShaderAccessTests.cpp"
                    ,0x4c7);
  pDVar2 = (this->super_SingleTargetRenderInstance).m_vki;
  VVar5 = (*pDVar2->_vptr_DeviceInterface[0x16])
                    (pDVar2,(this->super_SingleTargetRenderInstance).m_device,1,&rsState,0,
                     0xffffffffffffffff);
  ::vk::checkResult(VVar5,"m_vki.waitForFences(m_device, 1, &fence.get(), 0u, infiniteTimeout)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/binding_model/vktBindingShaderAccessTests.cpp"
                    ,0x4c9);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)6>_> *)&rsState);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)local_308);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)local_278);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_488);
  return;
}

Assistant:

void SingleCmdRenderInstance::renderToTarget (void)
{
	const vk::VkRect2D									renderArea						=
	{
		{ 0, 0 },								// offset
		{ m_targetSize.x(), m_targetSize.y() },	// extent
	};
	const vk::VkCommandBufferBeginInfo					mainCmdBufBeginInfo				=
	{
		vk::VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,
		DE_NULL,
		vk::VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT,	// flags
		(const vk::VkCommandBufferInheritanceInfo*)DE_NULL,
	};
	const vk::VkCommandBufferInheritanceInfo			passCmdBufInheritInfo			=
	{
		vk::VK_STRUCTURE_TYPE_COMMAND_BUFFER_INHERITANCE_INFO,
		DE_NULL,
		(vk::VkRenderPass)*m_renderPass,						// renderPass
		0u,														// subpass
		(vk::VkFramebuffer)*m_framebuffer,						// framebuffer
		VK_FALSE,												// occlusionQueryEnable
		(vk::VkQueryControlFlags)0,
		(vk::VkQueryPipelineStatisticFlags)0,
	};
	const vk::VkCommandBufferBeginInfo					passCmdBufBeginInfo				=
	{
		vk::VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,
		DE_NULL,
		vk::VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT |
		vk::VK_COMMAND_BUFFER_USAGE_RENDER_PASS_CONTINUE_BIT,	// flags
		&passCmdBufInheritInfo,
	};
	const vk::VkClearValue								clearValue					= vk::makeClearValueColorF32(0.0f, 0.0f, 0.0f, 0.0f);
	const vk::VkRenderPassBeginInfo						renderPassBeginInfo			=
	{
		vk::VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO,
		DE_NULL,
		*m_renderPass,		// renderPass
		*m_framebuffer,		// framebuffer
		renderArea,			// renderArea
		1u,					// clearValueCount
		&clearValue,		// pClearValues
	};

	const vk::VkPipelineLayout							pipelineLayout				(getPipelineLayout());
	const vk::Unique<vk::VkPipeline>					pipeline					(createPipeline(pipelineLayout));
	const vk::Unique<vk::VkCommandBuffer>				mainCmd						(vk::allocateCommandBuffer(m_vki, m_device, *m_cmdPool, vk::VK_COMMAND_BUFFER_LEVEL_PRIMARY));
	const vk::Unique<vk::VkCommandBuffer>				passCmd						((m_isPrimaryCmdBuf) ? (vk::Move<vk::VkCommandBuffer>()) : (vk::allocateCommandBuffer(m_vki, m_device, *m_cmdPool, vk::VK_COMMAND_BUFFER_LEVEL_SECONDARY)));
	const vk::Unique<vk::VkFence>						fence						(vk::createFence(m_vki, m_device));
	const deUint64										infiniteTimeout				= ~(deUint64)0u;
	const vk::VkSubpassContents							passContents				= (m_isPrimaryCmdBuf) ? (vk::VK_SUBPASS_CONTENTS_INLINE) : (vk::VK_SUBPASS_CONTENTS_SECONDARY_COMMAND_BUFFERS);

	VK_CHECK(m_vki.beginCommandBuffer(*mainCmd, &mainCmdBufBeginInfo));
	m_vki.cmdBeginRenderPass(*mainCmd, &renderPassBeginInfo, passContents);

	if (m_isPrimaryCmdBuf)
	{
		m_vki.cmdBindPipeline(*mainCmd, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
		writeDrawCmdBuffer(*mainCmd);
	}
	else
	{
		VK_CHECK(m_vki.beginCommandBuffer(*passCmd, &passCmdBufBeginInfo));
		m_vki.cmdBindPipeline(*passCmd, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
		writeDrawCmdBuffer(*passCmd);
		VK_CHECK(m_vki.endCommandBuffer(*passCmd));

		m_vki.cmdExecuteCommands(*mainCmd, 1, &passCmd.get());
	}

	m_vki.cmdEndRenderPass(*mainCmd);
	VK_CHECK(m_vki.endCommandBuffer(*mainCmd));

	// submit and wait for them to finish before exiting scope. (Killing in-flight objects is a no-no).
	{
		const vk::VkSubmitInfo	submitInfo	=
		{
			vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,
			DE_NULL,
			0u,
			(const vk::VkSemaphore*)0,
			(const vk::VkPipelineStageFlags*)DE_NULL,
			1u,
			&mainCmd.get(),
			0u,
			(const vk::VkSemaphore*)0,
		};
		VK_CHECK(m_vki.queueSubmit(m_queue, 1, &submitInfo, *fence));
	}
	VK_CHECK(m_vki.waitForFences(m_device, 1, &fence.get(), 0u, infiniteTimeout)); // \note: timeout is failure
}